

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_connection.cpp
# Opt level: O3

void __thiscall myutils::IpcConnection::do_recv(IpcConnection *this)

{
  Connection_Callback *pCVar1;
  int iVar2;
  int in_ECX;
  int iVar3;
  size_t size;
  char *data;
  undefined8 local_30;
  pollfd local_28;
  
  if (this->m_recv_queue != (ShmemQueue *)0x0) {
    iVar3 = 10;
    do {
      iVar2 = ShmemQueue::poll(this->m_recv_queue,&local_28,(nfds_t)&local_30,in_ECX);
      if ((char)iVar2 == '\0') {
        return;
      }
      pCVar1 = this->m_callback;
      if (pCVar1 != (Connection_Callback *)0x0) {
        (**pCVar1->_vptr_Connection_Callback)(pCVar1,local_28,local_30);
      }
      ShmemQueue::pop(this->m_recv_queue);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return;
}

Assistant:

void IpcConnection::do_recv()
{
    if (!m_recv_queue) return;

    const char* data;
    size_t size;

    // at most read 10 msgs in one loop
    for (int i = 0; i < 10; i++) {
        if (m_recv_queue->poll(&data, &size) ) {
            if (m_callback)
                m_callback->on_recv(data, size);
            m_recv_queue->pop();
        }
        else {
            break;
        }
    }
}